

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int arkRelax(ARKodeMem ark_mem,int *relax_fails,sunrealtype *dsm_inout)

{
  undefined4 uVar1;
  double *in_RDX;
  int *in_RSI;
  ARKodeMem in_RDI;
  ARKodeRelaxMem relax_mem;
  sunrealtype relax_val;
  int retval;
  sunrealtype *in_stack_ffffffffffffffb8;
  ARKodeRelaxMem in_stack_ffffffffffffffc0;
  double dVar2;
  ARKodeMem ark_mem_00;
  double local_30;
  int local_4;
  
  ark_mem_00 = (ARKodeMem)in_RDI->relax_mem;
  if (ark_mem_00 == (ARKodeMem)0x0) {
    arkProcessError(in_RDI,-0x2c,0x364,"arkRelax",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"Relaxation memory is NULL.");
    local_4 = -0x2c;
  }
  else {
    local_4 = arkRelaxSolve(ark_mem_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (-1 < local_4) {
      if (local_4 < 1) {
        in_RDI->h = local_30 * in_RDI->h;
        dVar2 = local_30;
        uVar1 = (**(code **)&ark_mem_00->itol)(in_RDI);
        dVar2 = (double)SUNRpowerI(SUB84(dVar2,0),uVar1);
        *in_RDX = dVar2 * *in_RDX;
        N_VLinearSum(SUB84(local_30,0),1.0 - local_30,in_RDI->ycur,in_RDI->yn,in_RDI->ycur);
        local_4 = 0;
      }
      else {
        *(long *)&ark_mem_00->atolmin0 = *(long *)&ark_mem_00->atolmin0 + 1;
        *in_RSI = *in_RSI + 1;
        if (*in_RSI == *(int *)&ark_mem_00->reltol) {
          local_4 = -0x2b;
        }
        else if (in_RDI->hmin * 1.000001 < ABS(in_RDI->h)) {
          if (in_RDI->fixedstep == 0) {
            in_RDI->eta = *(sunrealtype *)&ark_mem_00->constraintsSet;
            local_4 = 5;
          }
          else {
            local_4 = -0x2b;
          }
        }
        else {
          local_4 = -0x2b;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int arkRelax(ARKodeMem ark_mem, int* relax_fails, sunrealtype* dsm_inout)
{
  int retval;
  sunrealtype relax_val;
  ARKodeRelaxMem relax_mem = ark_mem->relax_mem;

  /* Get the relaxation memory structure */
  if (!relax_mem)
  {
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_RELAX_MEM_NULL);
    return ARK_RELAX_MEM_NULL;
  }

  /* Compute the relaxation parameter */
  retval = arkRelaxSolve(ark_mem, relax_mem, &relax_val);
  if (retval < 0) { return retval; }
  if (retval > 0)
  {
    /* Update failure counts */
    relax_mem->num_fails++;
    (*relax_fails)++;

    /* Check for max fails in a step */
    if (*relax_fails == relax_mem->max_fails) { return ARK_RELAX_FAIL; }

    /* Return with an error if |h| == hmin */
    if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
    {
      return ARK_RELAX_FAIL;
    }

    /* Return with error if using fixed step sizes */
    if (ark_mem->fixedstep) { return (ARK_RELAX_FAIL); }

    /* Cut step size and try again */
    ark_mem->eta = relax_mem->eta_fail;

    return TRY_AGAIN;
  }

  /* Update step size and error estimate */
  ark_mem->h *= relax_val;
  *dsm_inout *= SUNRpowerI(relax_val, relax_mem->get_order_fn(ark_mem));

  /* Relax solution */
  N_VLinearSum(relax_val, ark_mem->ycur, (ONE - relax_val), ark_mem->yn,
               ark_mem->ycur);

  SUNLogDebug(ARK_LOGGER, "relaxation",
              "relaxation parameter = " SUN_FORMAT_G
              ", relaxed h = " SUN_FORMAT_G ", relaxed error = " SUN_FORMAT_G,
              relax_val, ark_mem->h, *dsm_inout);

  return ARK_SUCCESS;
}